

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test4::GPUShaderFP64Test4(GPUShaderFP64Test4 *this,Context *context)

{
  undefined8 *puVar1;
  long lVar2;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"state_query",
             "Verifies glGet*() calls, as well as \"program interface query\"-specific tools report correct properties of & values assigned to double-precision uniforms."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020d3468;
  this->m_has_test_passed = true;
  this->m_uniform_name_buffer = (char *)0x0;
  this->m_cs_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_cs_id = 0;
  this->m_po_noncs_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_vs_id = 0;
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->m_data_cs).uniform_structure_arrays[0].uniform_double_arr + lVar2 + -8);
    *puVar1 = 0;
    memset(puVar1 + 3,0,0xd8);
    *(undefined4 *)(puVar1 + 0x1e) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xf4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x1f) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xfc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x20) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x104) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x21) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x10c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x22) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x114) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x23) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x11c) = 0xffffffff;
    lVar2 = lVar2 + 0x120;
  } while (lVar2 != 0x240);
  (this->m_data_cs).uniforms.uniform_double = 0.0;
  lVar2 = 0;
  memset((this->m_data_cs).uniforms.uniform_dvec2,0,0xd8);
  (this->m_data_cs).uniforms.uniform_location_double = -1;
  (this->m_data_cs).uniforms.uniform_location_double_arr[0] = -1;
  (this->m_data_cs).uniforms.uniform_location_double_arr[1] = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec2 = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec2_arr[0] = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec2_arr[1] = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec3 = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec3_arr[0] = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec3_arr[1] = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec4 = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec4_arr[0] = -1;
  (this->m_data_cs).uniforms.uniform_location_dvec4_arr[1] = -1;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->m_data_fs).uniform_structure_arrays[0].uniform_double_arr + lVar2 + -8);
    *puVar1 = 0;
    memset(puVar1 + 3,0,0xd8);
    *(undefined4 *)(puVar1 + 0x1e) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xf4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x1f) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xfc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x20) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x104) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x21) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x10c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x22) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x114) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x23) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x11c) = 0xffffffff;
    lVar2 = lVar2 + 0x120;
  } while (lVar2 != 0x240);
  (this->m_data_fs).uniforms.uniform_double = 0.0;
  lVar2 = 0;
  memset((this->m_data_fs).uniforms.uniform_dvec2,0,0xd8);
  (this->m_data_fs).uniforms.uniform_location_double = -1;
  (this->m_data_fs).uniforms.uniform_location_double_arr[0] = -1;
  (this->m_data_fs).uniforms.uniform_location_double_arr[1] = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec2 = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec2_arr[0] = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec2_arr[1] = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec3 = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec3_arr[0] = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec3_arr[1] = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec4 = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec4_arr[0] = -1;
  (this->m_data_fs).uniforms.uniform_location_dvec4_arr[1] = -1;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->m_data_gs).uniform_structure_arrays[0].uniform_double_arr + lVar2 + -8);
    *puVar1 = 0;
    memset(puVar1 + 3,0,0xd8);
    *(undefined4 *)(puVar1 + 0x1e) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xf4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x1f) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xfc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x20) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x104) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x21) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x10c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x22) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x114) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x23) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x11c) = 0xffffffff;
    lVar2 = lVar2 + 0x120;
  } while (lVar2 != 0x240);
  (this->m_data_gs).uniforms.uniform_double = 0.0;
  lVar2 = 0;
  memset((this->m_data_gs).uniforms.uniform_dvec2,0,0xd8);
  (this->m_data_gs).uniforms.uniform_location_double = -1;
  (this->m_data_gs).uniforms.uniform_location_double_arr[0] = -1;
  (this->m_data_gs).uniforms.uniform_location_double_arr[1] = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec2 = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec2_arr[0] = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec2_arr[1] = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec3 = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec3_arr[0] = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec3_arr[1] = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec4 = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec4_arr[0] = -1;
  (this->m_data_gs).uniforms.uniform_location_dvec4_arr[1] = -1;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->m_data_tc).uniform_structure_arrays[0].uniform_double_arr + lVar2 + -8);
    *puVar1 = 0;
    memset(puVar1 + 3,0,0xd8);
    *(undefined4 *)(puVar1 + 0x1e) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xf4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x1f) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xfc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x20) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x104) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x21) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x10c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x22) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x114) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x23) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x11c) = 0xffffffff;
    lVar2 = lVar2 + 0x120;
  } while (lVar2 != 0x240);
  (this->m_data_tc).uniforms.uniform_double = 0.0;
  lVar2 = 0;
  memset((this->m_data_tc).uniforms.uniform_dvec2,0,0xd8);
  (this->m_data_tc).uniforms.uniform_location_double = -1;
  (this->m_data_tc).uniforms.uniform_location_double_arr[0] = -1;
  (this->m_data_tc).uniforms.uniform_location_double_arr[1] = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec2 = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec2_arr[0] = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec2_arr[1] = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec3 = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec3_arr[0] = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec3_arr[1] = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec4 = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec4_arr[0] = -1;
  (this->m_data_tc).uniforms.uniform_location_dvec4_arr[1] = -1;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->m_data_te).uniform_structure_arrays[0].uniform_double_arr + lVar2 + -8);
    *puVar1 = 0;
    memset(puVar1 + 3,0,0xd8);
    *(undefined4 *)(puVar1 + 0x1e) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xf4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x1f) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xfc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x20) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x104) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x21) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x10c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x22) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x114) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x23) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x11c) = 0xffffffff;
    lVar2 = lVar2 + 0x120;
  } while (lVar2 != 0x240);
  (this->m_data_te).uniforms.uniform_double = 0.0;
  lVar2 = 0;
  memset((this->m_data_te).uniforms.uniform_dvec2,0,0xd8);
  (this->m_data_te).uniforms.uniform_location_double = -1;
  (this->m_data_te).uniforms.uniform_location_double_arr[0] = -1;
  (this->m_data_te).uniforms.uniform_location_double_arr[1] = -1;
  (this->m_data_te).uniforms.uniform_location_dvec2 = -1;
  (this->m_data_te).uniforms.uniform_location_dvec2_arr[0] = -1;
  (this->m_data_te).uniforms.uniform_location_dvec2_arr[1] = -1;
  (this->m_data_te).uniforms.uniform_location_dvec3 = -1;
  (this->m_data_te).uniforms.uniform_location_dvec3_arr[0] = -1;
  (this->m_data_te).uniforms.uniform_location_dvec3_arr[1] = -1;
  (this->m_data_te).uniforms.uniform_location_dvec4 = -1;
  (this->m_data_te).uniforms.uniform_location_dvec4_arr[0] = -1;
  (this->m_data_te).uniforms.uniform_location_dvec4_arr[1] = -1;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->m_data_vs).uniform_structure_arrays[0].uniform_double_arr + lVar2 + -8);
    *puVar1 = 0;
    memset(puVar1 + 3,0,0xd8);
    *(undefined4 *)(puVar1 + 0x1e) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xf4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x1f) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xfc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x20) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x104) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x21) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x10c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x22) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x114) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x23) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x11c) = 0xffffffff;
    lVar2 = lVar2 + 0x120;
  } while (lVar2 != 0x240);
  (this->m_data_vs).uniforms.uniform_double = 0.0;
  memset((this->m_data_vs).uniforms.uniform_dvec2,0,0xd8);
  (this->m_data_vs).uniforms.uniform_location_double = -1;
  (this->m_data_vs).uniforms.uniform_location_double_arr[0] = -1;
  (this->m_data_vs).uniforms.uniform_location_double_arr[1] = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec2 = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec2_arr[0] = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec2_arr[1] = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec3 = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec3_arr[0] = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec3_arr[1] = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec4 = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec4_arr[0] = -1;
  (this->m_data_vs).uniforms.uniform_location_dvec4_arr[1] = -1;
  return;
}

Assistant:

GPUShaderFP64Test4::GPUShaderFP64Test4(deqp::Context& context)
	: TestCase(context, "state_query", "Verifies glGet*() calls, as well as \"program interface query\"-specific tools"
									   " report correct properties of & values assigned to double-precision uniforms.")
	, m_has_test_passed(true)
	, m_uniform_name_buffer(0)
	, m_cs_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_cs_id(0)
	, m_po_noncs_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}